

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::a64::EmitHelper::emitEpilog(EmitHelper *this,FuncFrame *frame)

{
  uint8_t uVar1;
  uint16_t uVar2;
  BaseEmitter *this_00;
  Error EVar3;
  int iVar4;
  GroupData *pGVar5;
  Reg *pRVar6;
  LoadStoreInstructions *pLVar7;
  uint32_t uVar8;
  uint uVar9;
  ulong uVar10;
  uint32_t hi;
  uint32_t lo;
  RegGroup group;
  Operand_ local_108;
  int local_ec;
  Reg regs [2];
  PrologEpilogInfo pei;
  
  this_00 = (this->super_BaseEmitHelper)._emitter;
  EVar3 = PrologEpilogInfo::init(&pei,(EVP_PKEY_CTX *)frame);
  if (EVar3 != 0) {
    return EVar3;
  }
  uVar9 = frame->_stackAdjustment;
  if (uVar9 != 0) {
    if (0xfff < uVar9) {
      if (0xffffff < uVar9) {
        return 3;
      }
      regs[0].super_BaseReg.super_Operand.super_Operand_._signature._bits = 4;
      regs[0].super_BaseReg.super_Operand.super_Operand_._baseId = 0;
      regs[0].super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
      regs[0].super_BaseReg.super_Operand.super_Operand_._data[0] = uVar9 & 0xfff;
      EVar3 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::add
                        ((EmitterExplicitT<asmjit::v1_14::a64::Emitter> *)this_00,
                         (Gp *)a64::regs::sp,(Gp *)a64::regs::sp,(Imm *)regs);
      if (EVar3 != 0) {
        return EVar3;
      }
      uVar9 = uVar9 & 0xfff000;
    }
    regs[0].super_BaseReg.super_Operand.super_Operand_._signature._bits = 4;
    regs[0].super_BaseReg.super_Operand.super_Operand_._baseId = 0;
    regs[0].super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
    regs[0].super_BaseReg.super_Operand.super_Operand_._data[0] = uVar9;
    EVar3 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::add
                      ((EmitterExplicitT<asmjit::v1_14::a64::Emitter> *)this_00,(Gp *)a64::regs::sp,
                       (Gp *)a64::regs::sp,(Imm *)regs);
    if (EVar3 != 0) {
      return EVar3;
    }
  }
  iVar4 = 1;
  do {
    if (iVar4 < 0) {
      EVar3 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::ret
                        ((EmitterExplicitT<asmjit::v1_14::a64::Emitter> *)this_00,
                         (Gp *)a64::regs::x30);
      return EVar3;
    }
    group = (RegGroup)iVar4;
    local_ec = iVar4;
    pGVar5 = Support::Array<asmjit::v1_14::a64::PrologEpilogInfo::GroupData,_2UL>::
             operator[]<asmjit::v1_14::RegGroup>(&pei.groups,&group);
    uVar9 = pGVar5->pairCount;
    pRVar6 = Support::Array<asmjit::v1_14::arm::Reg,_2UL>::operator[]<asmjit::v1_14::RegGroup>
                       (&emitEpilog::groupRegs,&group);
    regs[0].super_BaseReg.super_Operand.super_Operand_._signature._bits =
         (pRVar6->super_BaseReg).super_Operand.super_Operand_._signature._bits;
    regs[0].super_BaseReg.super_Operand.super_Operand_._baseId =
         (pRVar6->super_BaseReg).super_Operand.super_Operand_._baseId;
    regs[0].super_BaseReg.super_Operand.super_Operand_._data =
         *&(pRVar6->super_BaseReg).super_Operand.super_Operand_._data;
    pRVar6 = Support::Array<asmjit::v1_14::arm::Reg,_2UL>::operator[]<asmjit::v1_14::RegGroup>
                       (&emitEpilog::groupRegs,&group);
    regs[1].super_BaseReg.super_Operand.super_Operand_._signature._bits =
         (pRVar6->super_BaseReg).super_Operand.super_Operand_._signature._bits;
    regs[1].super_BaseReg.super_Operand.super_Operand_._baseId =
         (pRVar6->super_BaseReg).super_Operand.super_Operand_._baseId;
    regs[1].super_BaseReg.super_Operand.super_Operand_._data =
         *&(pRVar6->super_BaseReg).super_Operand.super_Operand_._data;
    local_108._signature._bits = 0x3a;
    local_108._baseId = 0x1f;
    local_108._data[0] = 0;
    local_108._data[1] = 0;
    pLVar7 = Support::Array<asmjit::v1_14::a64::LoadStoreInstructions,_2UL>::
             operator[]<asmjit::v1_14::RegGroup>(&emitEpilog::groupInsts,&group);
    for (uVar10 = (ulong)uVar9; 0 < (int)uVar10; uVar10 = uVar10 - 1) {
      regs[0].super_BaseReg.super_Operand.super_Operand_._baseId._0_1_ =
           pGVar5->pairs[uVar10 - 1].ids[0];
      regs[0].super_BaseReg.super_Operand.super_Operand_._baseId._1_3_ = 0;
      uVar1 = pGVar5->pairs[uVar10 - 1].ids[1];
      regs[1].super_BaseReg.super_Operand.super_Operand_._baseId._0_1_ = uVar1;
      regs[1].super_BaseReg.super_Operand.super_Operand_._baseId._1_3_ = 0;
      uVar2 = pGVar5->pairs[uVar10 - 1].offset;
      local_108._data[1]._0_2_ = uVar2;
      local_108._data[1]._2_2_ = 0;
      if (uVar2 == 0 && pei.sizeTotal != 0) {
        local_108._data[1] = pei.sizeTotal;
        uVar8 = (int)pei.sizeTotal >> 0x1f;
        if ((local_108._0_8_ & 0xf8) != 0) {
          uVar8 = local_108._baseId;
        }
        local_108._0_8_ =
             CONCAT44(uVar8,local_108._signature._bits) & 0xfffffffffcffffff | 0x2000000;
      }
      if (uVar1 == 0xff) {
        EVar3 = BaseEmitter::_emitI(this_00,pLVar7->singleInstId,(Operand_ *)regs,&local_108);
      }
      else {
        EVar3 = BaseEmitter::_emitI(this_00,pLVar7->pairInstId,(Operand_ *)regs,
                                    (Operand_ *)(regs + 1),&local_108);
      }
      if (EVar3 != 0) {
        return EVar3;
      }
      local_108._0_8_ = local_108._0_8_ & 0xfffffffffcffffff;
    }
    iVar4 = local_ec + -1;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitEpilog(const FuncFrame& frame) {
  Emitter* emitter = _emitter->as<Emitter>();

  PrologEpilogInfo pei;
  ASMJIT_PROPAGATE(pei.init(frame));

  static const Support::Array<Reg, 2> groupRegs = {{ x0, d0 }};
  static const Support::Array<LoadStoreInstructions, 2> groupInsts = {{
    { Inst::kIdLdr  , Inst::kIdLdp   },
    { Inst::kIdLdr_v, Inst::kIdLdp_v }
  }};

  uint32_t adjustInitialOffset = pei.sizeTotal;

  if (frame.hasStackAdjustment()) {
    uint32_t adj = frame.stackAdjustment();
    if (adj <= 0xFFFu) {
      ASMJIT_PROPAGATE(emitter->add(sp, sp, adj));
    }
    else if (adj <= 0xFFFFFFu)  {
      ASMJIT_PROPAGATE(emitter->add(sp, sp, adj & 0x000FFFu));
      ASMJIT_PROPAGATE(emitter->add(sp, sp, adj & 0xFFF000u));
    }
    else {
      return DebugUtils::errored(kErrorInvalidState);
    }
  }

  for (int g = 1; g >= 0; g--) {
    RegGroup group = RegGroup(g);
    const PrologEpilogInfo::GroupData& data = pei.groups[group];
    uint32_t pairCount = data.pairCount;

    Reg regs[2] = { groupRegs[group], groupRegs[group] };
    Mem mem = ptr(sp);

    const LoadStoreInstructions& insts = groupInsts[group];

    for (int i = int(pairCount) - 1; i >= 0; i--) {
      const PrologEpilogInfo::RegPair& pair = data.pairs[i];

      regs[0].setId(pair.ids[0]);
      regs[1].setId(pair.ids[1]);
      mem.setOffsetLo32(pair.offset);

      if (pair.offset == 0 && adjustInitialOffset) {
        mem.setOffset(int(adjustInitialOffset));
        mem.makePostIndex();
      }

      if (pair.ids[1] == BaseReg::kIdBad)
        ASMJIT_PROPAGATE(emitter->emit(insts.singleInstId, regs[0], mem));
      else
        ASMJIT_PROPAGATE(emitter->emit(insts.pairInstId, regs[0], regs[1], mem));

      mem.resetOffsetMode();
    }
  }

  ASMJIT_PROPAGATE(emitter->ret(x30));

  return kErrorOk;
}